

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O0

void Curl_conninfo_local(Curl_easy *data,curl_socket_t sockfd,char *param_3,int *param_4)

{
  uint uVar1;
  _Bool _Var2;
  int iVar3;
  uint *puVar4;
  char *pcVar5;
  int *piVar6;
  socklen_t local_1ac;
  int error;
  curl_socklen_t slen;
  Curl_sockaddr_storage ssloc;
  char buffer [256];
  int *local_port_local;
  char *local_ip_local;
  curl_socket_t sockfd_local;
  Curl_easy *data_local;
  
  local_1ac = 0x80;
  memset(&error,0,0x80);
  iVar3 = getsockname(sockfd,(sockaddr *)&error,&local_1ac);
  if (iVar3 == 0) {
    _Var2 = Curl_addr2string((sockaddr *)&error,local_1ac,param_3,param_4);
    if (!_Var2) {
      puVar4 = (uint *)__errno_location();
      uVar1 = *puVar4;
      piVar6 = __errno_location();
      pcVar5 = Curl_strerror(*piVar6,(char *)&ssloc.buffer.sa_stor.__ss_align,0x100);
      Curl_failf(data,"ssloc inet_ntop() failed with errno %d: %s",(ulong)uVar1,pcVar5);
    }
  }
  else {
    puVar4 = (uint *)__errno_location();
    uVar1 = *puVar4;
    pcVar5 = Curl_strerror(uVar1,(char *)&ssloc.buffer.sa_stor.__ss_align,0x100);
    Curl_failf(data,"getsockname() failed with errno %d: %s",(ulong)uVar1,pcVar5);
  }
  return;
}

Assistant:

void Curl_conninfo_local(struct Curl_easy *data, curl_socket_t sockfd,
                         char *local_ip, int *local_port)
{
#ifdef HAVE_GETSOCKNAME
  char buffer[STRERROR_LEN];
  struct Curl_sockaddr_storage ssloc;
  curl_socklen_t slen;
  slen = sizeof(struct Curl_sockaddr_storage);
  memset(&ssloc, 0, sizeof(ssloc));
  if(getsockname(sockfd, (struct sockaddr*) &ssloc, &slen)) {
    int error = SOCKERRNO;
    failf(data, "getsockname() failed with errno %d: %s",
          error, Curl_strerror(error, buffer, sizeof(buffer)));
    return;
  }
  if(!Curl_addr2string((struct sockaddr*)&ssloc, slen,
                       local_ip, local_port)) {
    failf(data, "ssloc inet_ntop() failed with errno %d: %s",
          errno, Curl_strerror(errno, buffer, sizeof(buffer)));
    return;
  }
#else
  (void)data;
  (void)sockfd;
  (void)local_ip;
  (void)local_port;
#endif
}